

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::span
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  UChar *pUVar1;
  short *psVar2;
  short *psVar3;
  byte bVar4;
  ushort uVar5;
  UChar UVar6;
  uint uVar7;
  uint uVar8;
  UBool UVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int32_t iVar13;
  UBool *pUVar14;
  void *pvVar15;
  char cVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  UChar *pUVar27;
  UChar *pUVar28;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  int local_bc;
  uint local_b8;
  OffsetList local_70;
  long local_48;
  UChar *local_40;
  UChar *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar13 = spanNot(this,s,length);
    return iVar13;
  }
  this_00 = &this->spanSet;
  uVar10 = UnicodeSet::span(this_00,s,length,USET_SPAN_CONTAINED);
  local_bc = length - uVar10;
  if (local_bc == 0) {
    return length;
  }
  local_70.list = local_70.staticList;
  local_70.capacity = 0;
  local_70.length = 0;
  local_70.start = 0;
  if (spanCondition == USET_SPAN_CONTAINED) {
    iVar18 = this->maxLength16;
    iVar22 = 0x10;
    pUVar14 = local_70.list;
    if (((long)iVar18 < 0x11) ||
       (pUVar14 = (UBool *)uprv_malloc_63((long)iVar18), iVar22 = iVar18, pUVar14 != (UBool *)0x0))
    {
      local_70.list = pUVar14;
      local_70.capacity = iVar22;
    }
    memset(local_70.list,0,(long)local_70.capacity);
  }
  uVar7 = this->strings->count;
  local_48 = (long)length;
  uVar12 = uVar10;
  local_40 = s;
LAB_002e0201:
  if (spanCondition == USET_SPAN_CONTAINED) {
    pUVar28 = s;
    if (0 < (int)uVar7) {
      uVar29 = 0;
      do {
        bVar4 = this->spanLengths[uVar29];
        if (bVar4 == 0xff) {
          iVar18 = 6;
        }
        else {
          pvVar15 = UVector::elementAt(this->strings,(int32_t)uVar29);
          uVar5 = *(ushort *)((long)pvVar15 + 8);
          if ((uVar5 & 0x11) == 0) {
            if ((uVar5 & 2) == 0) {
              lVar17 = *(long *)((long)pvVar15 + 0x18);
            }
            else {
              lVar17 = (long)pvVar15 + 10;
            }
          }
          else {
            lVar17 = 0;
          }
          if ((short)uVar5 < 0) {
            uVar11 = *(uint *)((long)pvVar15 + 0xc);
          }
          else {
            uVar11 = (int)(short)uVar5 >> 5;
          }
          uVar30 = (uint)bVar4;
          if ((((bVar4 == 0xfe) && (uVar30 = uVar11 - 1, 1 < (int)uVar11)) &&
              ((*(ushort *)(lVar17 + -2 + (long)(int)uVar11 * 2) & 0xfc00) == 0xdc00)) &&
             ((*(ushort *)(lVar17 + -4 + (ulong)uVar11 * 2) & 0xfc00) == 0xd800)) {
            uVar30 = uVar11 - 2;
          }
          uVar8 = uVar12;
          if ((int)uVar30 < (int)uVar12) {
            uVar8 = uVar30;
          }
          iVar18 = 0;
          if ((int)(uVar11 - uVar8) <= local_bc) {
            lVar26 = (long)(int)uVar11;
            if ((int)uVar12 <= (int)uVar30) {
              uVar30 = uVar12;
            }
            lVar24 = (long)(int)uVar30;
            pUVar27 = s + ((int)uVar10 - lVar24);
            iVar18 = uVar11 - uVar8;
            do {
              iVar13 = local_70.capacity;
              if (local_70.start + iVar18 < local_70.capacity) {
                iVar13 = 0;
              }
              iVar22 = (local_70.start + iVar18) - iVar13;
              if (local_70.list[iVar22] == '\0') {
                lVar20 = (int)uVar10 - lVar24;
                pUVar1 = pUVar28 + lVar20;
                lVar23 = 0;
                uVar30 = uVar11;
                do {
                  psVar2 = (short *)((long)pUVar27 + lVar23);
                  psVar3 = (short *)(lVar17 + lVar23);
                  if (*psVar2 != *psVar3) break;
                  lVar23 = lVar23 + 2;
                  bVar31 = 1 < (int)uVar30;
                  uVar30 = uVar30 - 1;
                } while (bVar31);
                pUVar28 = local_40;
                if ((*psVar2 == *psVar3) &&
                   ((((lVar20 < 1 || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                     ((*pUVar1 & 0xfc00U) != 0xdc00)) &&
                    (((local_48 - lVar26 <= lVar20 || ((pUVar1[lVar26 + -1] & 0xfc00U) != 0xd800))
                     || ((pUVar1[lVar26] & 0xfc00U) != 0xdc00)))))) {
                  if (iVar18 == local_bc) {
                    iVar18 = 1;
                    local_b8 = length;
                    goto LAB_002e041e;
                  }
                  local_70.list[iVar22] = '\x01';
                  local_70.length = local_70.length + 1;
                }
              }
              bVar31 = lVar24 == 0;
              lVar24 = lVar24 + -1;
              if (bVar31) break;
              pUVar27 = pUVar27 + 1;
              bVar31 = iVar18 != local_bc;
              iVar18 = iVar18 + 1;
            } while (bVar31);
            iVar18 = 0;
          }
        }
LAB_002e041e:
        if ((iVar18 != 6) && (uVar11 = local_b8, iVar18 != 0)) goto LAB_002e07d3;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar7);
    }
  }
  else {
    if ((int)uVar7 < 1) {
      iVar18 = 0;
      bVar31 = false;
    }
    else {
      local_38 = s + (int)uVar10;
      uVar29 = 0;
      uVar25 = 0;
      iVar18 = 0;
      do {
        iVar22 = (int)uVar25;
        bVar4 = this->spanLengths[uVar29];
        pvVar15 = UVector::elementAt(this->strings,(int32_t)uVar29);
        uVar5 = *(ushort *)((long)pvVar15 + 8);
        if ((uVar5 & 0x11) == 0) {
          if ((uVar5 & 2) == 0) {
            lVar17 = *(long *)((long)pvVar15 + 0x18);
          }
          else {
            lVar17 = (long)pvVar15 + 10;
          }
        }
        else {
          lVar17 = 0;
        }
        if ((short)uVar5 < 0) {
          uVar11 = *(uint *)((long)pvVar15 + 0xc);
        }
        else {
          uVar11 = (int)(short)uVar5 >> 5;
        }
        uVar30 = (uint)bVar4;
        if (0xfd < bVar4) {
          uVar30 = uVar11;
        }
        uVar8 = uVar12;
        if ((int)uVar30 < (int)uVar12) {
          uVar8 = uVar30;
        }
        iVar19 = uVar11 - uVar8;
        if ((iVar19 <= local_bc) && (iVar22 <= (int)uVar8)) {
          if ((int)uVar12 <= (int)uVar30) {
            uVar30 = uVar12;
          }
          lVar26 = (long)(int)uVar11;
          pUVar28 = local_38 + -(long)(int)uVar30;
          uVar21 = (long)(int)uVar30;
          do {
            if (((long)iVar22 < (long)uVar21) || (iVar18 < iVar19)) {
              lVar24 = (long)(int)uVar10 - uVar21;
              pUVar27 = s + lVar24;
              lVar20 = 0;
              uVar30 = uVar11;
              do {
                psVar2 = (short *)((long)pUVar28 + lVar20);
                psVar3 = (short *)(lVar17 + lVar20);
                if (*psVar2 != *psVar3) break;
                lVar20 = lVar20 + 2;
                bVar31 = 1 < (int)uVar30;
                uVar30 = uVar30 - 1;
              } while (bVar31);
              s = local_40;
              if (((*psVar2 == *psVar3) &&
                  (((lVar24 < 1 || ((pUVar27[-1] & 0xfc00U) != 0xd800)) ||
                   ((*pUVar27 & 0xfc00U) != 0xdc00)))) &&
                 (((local_48 - lVar26 <= lVar24 || ((pUVar27[lVar26 + -1] & 0xfc00U) != 0xd800)) ||
                  ((pUVar27[lVar26] & 0xfc00U) != 0xdc00)))) {
                uVar25 = uVar21 & 0xffffffff;
                iVar18 = iVar19;
                break;
              }
            }
            if (local_bc <= iVar19) break;
            iVar19 = iVar19 + 1;
            pUVar28 = pUVar28 + 1;
            bVar31 = (long)iVar22 < (long)uVar21;
            uVar21 = uVar21 - 1;
          } while (bVar31);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar7);
      bVar31 = (int)uVar25 != 0;
    }
    cVar16 = '\0';
    if ((iVar18 != 0) || (uVar11 = uVar12, bVar31)) {
      uVar10 = uVar10 + iVar18;
      local_bc = local_bc - iVar18;
      cVar16 = (local_bc != 0) * '\x02' + '\x01';
      uVar11 = 0;
      if (local_bc == 0) {
        uVar11 = uVar12;
        local_b8 = length;
      }
    }
    uVar12 = uVar11;
    if (cVar16 == '\x03') goto LAB_002e0201;
    pUVar28 = s;
    uVar11 = local_b8;
    if (cVar16 != '\0') goto LAB_002e07d3;
  }
  s = pUVar28;
  if ((uVar12 == 0) && (uVar10 != 0)) {
    pUVar28 = pUVar28 + (int)uVar10;
    if (local_70.length == 0) {
      uVar12 = UnicodeSet::span(this_00,pUVar28,local_bc,USET_SPAN_CONTAINED);
      uVar10 = uVar10 + uVar12;
      local_bc = local_bc - uVar12;
      uVar11 = uVar10;
      if ((local_bc == 0) || (uVar12 == 0)) goto LAB_002e07d3;
    }
    else {
      UVar6 = *pUVar28;
      if ((local_bc < 2) ||
         (((UVar6 & 0xfc00U) != 0xd800 || (((ushort)pUVar28[1] & 0xfc00) != 0xdc00)))) {
        UVar9 = UnicodeSet::contains(this_00,(uint)(ushort)UVar6);
        uVar12 = -(uint)(UVar9 == '\0') | 1;
      }
      else {
        UVar9 = UnicodeSet::contains
                          (this_00,(uint)(ushort)UVar6 * 0x400 + (uint)(ushort)pUVar28[1] +
                                   -0x35fdc00);
        uVar12 = (uint)(UVar9 != '\0') * 4 - 2;
      }
      if ((int)uVar12 < 1) goto LAB_002e070b;
      local_bc = local_bc - uVar12;
      uVar11 = length;
      if (local_bc == 0) {
LAB_002e07d3:
        local_b8 = uVar11;
        OffsetList::~OffsetList(&local_70);
        return local_b8;
      }
      iVar13 = local_70.capacity;
      if ((int)(local_70.start + uVar12) < local_70.capacity) {
        iVar13 = 0;
      }
      local_70.start = (local_70.start + uVar12) - iVar13;
      if (local_70.list[local_70.start] != '\0') {
        local_70.list[local_70.start] = '\0';
        local_70.length = local_70.length + -1;
      }
      uVar10 = uVar10 + uVar12;
      uVar12 = 0;
    }
  }
  else {
    uVar11 = uVar10;
    if (local_70.length == 0) goto LAB_002e07d3;
LAB_002e070b:
    iVar13 = OffsetList::popMinimum(&local_70);
    uVar10 = uVar10 + iVar13;
    local_bc = local_bc - iVar13;
    uVar12 = 0;
  }
  goto LAB_002e0201;
}

Assistant:

int32_t UnicodeSetStringSpan::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNot(s, length);
    }
    int32_t spanLength=spanSet.span(s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    U16_BACK_1(s16, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    if(!offsets.containsOffset(inc) && matches16CPB(s, pos-overlap, length, s16, length16)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                        matches16CPB(s, pos-overlap, length, s16, length16)
                    ) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.span(s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOne(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}